

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_GLMRegressor_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0074a350 == '\x01') {
    DAT_0074a350 = '\0';
    (*(code *)*_GLMRegressor_DoubleArray_default_instance_)();
  }
  if (DAT_0074a3a0 == '\x01') {
    DAT_0074a3a0 = 0;
    (*(code *)*_GLMRegressor_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMRegressor_DoubleArray_default_instance_.Shutdown();
  _GLMRegressor_default_instance_.Shutdown();
}